

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_uncompressed.cpp
# Opt level: O1

void duckdb::UncompressedStringStorage::WriteString
               (ColumnSegment *segment,string_t string,block_id_t *result_block,
               int32_t *result_offset)

{
  _Head_base<0UL,_duckdb::CompressedSegmentState_*,_false> _Var1;
  pointer pOVar2;
  int32_t *in_R9;
  string_t string_00;
  _Head_base<0UL,_duckdb::CompressedSegmentState_*,_false> local_38;
  
  string_00.value._0_8_ = string.value._8_8_;
  local_38._M_head_impl =
       (segment->segment_state).
       super_unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::CompressedSegmentState_*,_std::default_delete<duckdb::CompressedSegmentState>_>
       .super__Head_base<0UL,_duckdb::CompressedSegmentState_*,_false>._M_head_impl;
  optional_ptr<duckdb::CompressedSegmentState,_true>::CheckValid
            ((optional_ptr<duckdb::CompressedSegmentState,_true> *)&local_38);
  _Var1._M_head_impl = local_38._M_head_impl;
  if (local_38._M_head_impl[9]._vptr_CompressedSegmentState == (_func_int **)0x0) {
    string_00.value.pointer.ptr = (char *)result_block;
    WriteStringMemory((UncompressedStringStorage *)segment,string.value._0_8_,string_00,
                      (block_id_t *)result_offset,in_R9);
  }
  else {
    pOVar2 = unique_ptr<duckdb::OverflowStringWriter,_std::default_delete<duckdb::OverflowStringWriter>,_true>
             ::operator->((unique_ptr<duckdb::OverflowStringWriter,_std::default_delete<duckdb::OverflowStringWriter>,_true>
                           *)(local_38._M_head_impl + 9));
    (*pOVar2->_vptr_OverflowStringWriter[2])
              (pOVar2,_Var1._M_head_impl,string.value._0_8_,string_00.value._0_8_,result_block,
               result_offset);
  }
  return;
}

Assistant:

void UncompressedStringStorage::WriteString(ColumnSegment &segment, string_t string, block_id_t &result_block,
                                            int32_t &result_offset) {
	auto &state = segment.GetSegmentState()->Cast<UncompressedStringSegmentState>();
	if (state.overflow_writer) {
		// overflow writer is set: write string there
		state.overflow_writer->WriteString(state, string, result_block, result_offset);
	} else {
		// default overflow behavior: use in-memory buffer to store the overflow string
		WriteStringMemory(segment, string, result_block, result_offset);
	}
}